

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableMessageGenerator::GenerateIsInitialized
          (ImmutableMessageGenerator *this,Printer *printer)

{
  Printer *pPVar1;
  bool bVar2;
  int iVar3;
  JavaType JVar4;
  Label LVar5;
  int iVar6;
  Descriptor *pDVar7;
  ClassNameResolver *pCVar8;
  string local_b8;
  string local_98;
  string local_68;
  FieldGeneratorInfo *local_48;
  FieldGeneratorInfo *info_1;
  FieldDescriptor *field_1;
  FieldGeneratorInfo *pFStack_30;
  int i_1;
  FieldGeneratorInfo *info;
  FieldDescriptor *field;
  Printer *pPStack_18;
  int i;
  Printer *printer_local;
  ImmutableMessageGenerator *this_local;
  
  pPStack_18 = printer;
  printer_local = (Printer *)this;
  io::Printer::Print<>(printer,"private byte memoizedIsInitialized = -1;\n");
  io::Printer::Print<>(pPStack_18,"@java.lang.Override\npublic final boolean isInitialized() {\n");
  io::Printer::Indent(pPStack_18);
  io::Printer::Print<>
            (pPStack_18,
             "byte isInitialized = memoizedIsInitialized;\nif (isInitialized == 1) return true;\nif (isInitialized == 0) return false;\n\n"
            );
  for (field._4_4_ = 0; iVar6 = field._4_4_,
      iVar3 = Descriptor::field_count((this->super_MessageGenerator).descriptor_), iVar6 < iVar3;
      field._4_4_ = field._4_4_ + 1) {
    info = (FieldGeneratorInfo *)
           Descriptor::field((this->super_MessageGenerator).descriptor_,field._4_4_);
    pFStack_30 = Context::GetFieldGeneratorInfo(this->context_,(FieldDescriptor *)info);
    bVar2 = FieldDescriptor::is_required((FieldDescriptor *)info);
    if (bVar2) {
      io::Printer::Print<char[5],std::__cxx11::string>
                (pPStack_18,
                 "if (!has$name$()) {\n  memoizedIsInitialized = 0;\n  return false;\n}\n",
                 (char (*) [5])0x77db8d,&pFStack_30->capitalized_name);
    }
  }
  for (field_1._4_4_ = 0; iVar6 = field_1._4_4_,
      iVar3 = Descriptor::field_count((this->super_MessageGenerator).descriptor_), iVar6 < iVar3;
      field_1._4_4_ = field_1._4_4_ + 1) {
    info_1 = (FieldGeneratorInfo *)
             Descriptor::field((this->super_MessageGenerator).descriptor_,field_1._4_4_);
    local_48 = Context::GetFieldGeneratorInfo(this->context_,(FieldDescriptor *)info_1);
    JVar4 = GetJavaType((FieldDescriptor *)info_1);
    if (JVar4 == JAVATYPE_MESSAGE) {
      pDVar7 = FieldDescriptor::message_type((FieldDescriptor *)info_1);
      bVar2 = HasRequiredFields(pDVar7);
      if (bVar2) {
        LVar5 = FieldDescriptor::label((FieldDescriptor *)info_1);
        pPVar1 = pPStack_18;
        pCVar8 = (ClassNameResolver *)(ulong)LVar5;
        if (LVar5 == LABEL_OPTIONAL) {
          io::Printer::Print<char[5],std::__cxx11::string>
                    (pPStack_18,
                     "if (has$name$()) {\n  if (!get$name$().isInitialized()) {\n    memoizedIsInitialized = 0;\n    return false;\n  }\n}\n"
                     ,(char (*) [5])0x77db8d,&local_48->capitalized_name);
        }
        else if (LVar5 == LABEL_REQUIRED) {
          pCVar8 = this->name_resolver_;
          pDVar7 = FieldDescriptor::message_type((FieldDescriptor *)info_1);
          ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
                    (&local_68,pCVar8,pDVar7);
          io::Printer::Print<char[5],std::__cxx11::string,char[5],std::__cxx11::string>
                    (pPVar1,
                     "if (!get$name$().isInitialized()) {\n  memoizedIsInitialized = 0;\n  return false;\n}\n"
                     ,(char (*) [5])0x7cd92b,&local_68,(char (*) [5])0x77db8d,
                     &local_48->capitalized_name);
          std::__cxx11::string::~string((string *)&local_68);
        }
        else if (LVar5 == LABEL_REPEATED) {
          pDVar7 = FieldDescriptor::message_type((FieldDescriptor *)info_1);
          bVar2 = IsMapEntry(pDVar7);
          pPVar1 = pPStack_18;
          if (bVar2) {
            pDVar7 = FieldDescriptor::message_type((FieldDescriptor *)info_1);
            (anonymous_namespace)::MapValueImmutableClassdName_abi_cxx11_
                      (&local_98,(_anonymous_namespace_ *)pDVar7,(Descriptor *)this->name_resolver_,
                       pCVar8);
            io::Printer::Print<char[5],std::__cxx11::string,char[5],std::__cxx11::string>
                      (pPVar1,
                       "for ($type$ item : get$name$Map().values()) {\n  if (!item.isInitialized()) {\n    memoizedIsInitialized = 0;\n    return false;\n  }\n}\n"
                       ,(char (*) [5])0x7cd92b,&local_98,(char (*) [5])0x77db8d,
                       &local_48->capitalized_name);
            std::__cxx11::string::~string((string *)&local_98);
          }
          else {
            pCVar8 = this->name_resolver_;
            pDVar7 = FieldDescriptor::message_type((FieldDescriptor *)info_1);
            ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
                      (&local_b8,pCVar8,pDVar7);
            io::Printer::Print<char[5],std::__cxx11::string,char[5],std::__cxx11::string>
                      (pPVar1,
                       "for (int i = 0; i < get$name$Count(); i++) {\n  if (!get$name$(i).isInitialized()) {\n    memoizedIsInitialized = 0;\n    return false;\n  }\n}\n"
                       ,(char (*) [5])0x7cd92b,&local_b8,(char (*) [5])0x77db8d,
                       &local_48->capitalized_name);
            std::__cxx11::string::~string((string *)&local_b8);
          }
        }
      }
    }
  }
  iVar6 = Descriptor::extension_range_count((this->super_MessageGenerator).descriptor_);
  if (0 < iVar6) {
    io::Printer::Print<>
              (pPStack_18,
               "if (!extensionsAreInitialized()) {\n  memoizedIsInitialized = 0;\n  return false;\n}\n"
              );
  }
  io::Printer::Outdent(pPStack_18);
  io::Printer::Print<>(pPStack_18,"  memoizedIsInitialized = 1;\n");
  io::Printer::Print<>(pPStack_18,"  return true;\n}\n\n");
  return;
}

Assistant:

void ImmutableMessageGenerator::GenerateIsInitialized(io::Printer* printer) {
  // Memoizes whether the protocol buffer is fully initialized (has all
  // required fields). -1 means not yet computed. 0 means false and 1 means
  // true.
  printer->Print("private byte memoizedIsInitialized = -1;\n");
  printer->Print(
      "@java.lang.Override\n"
      "public final boolean isInitialized() {\n");
  printer->Indent();

  // Don't directly compare to -1 to avoid an Android x86 JIT bug.
  printer->Print(
      "byte isInitialized = memoizedIsInitialized;\n"
      "if (isInitialized == 1) return true;\n"
      "if (isInitialized == 0) return false;\n"
      "\n");

  // Check that all required fields in this message are set.
  // TODO(kenton):  We can optimize this when we switch to putting all the
  //   "has" fields into a single bitfield.
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    const FieldGeneratorInfo* info = context_->GetFieldGeneratorInfo(field);

    if (field->is_required()) {
      printer->Print(
          "if (!has$name$()) {\n"
          "  memoizedIsInitialized = 0;\n"
          "  return false;\n"
          "}\n",
          "name", info->capitalized_name);
    }
  }

  // Now check that all embedded messages are initialized.
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    const FieldGeneratorInfo* info = context_->GetFieldGeneratorInfo(field);
    if (GetJavaType(field) == JAVATYPE_MESSAGE &&
        HasRequiredFields(field->message_type())) {
      switch (field->label()) {
        case FieldDescriptor::LABEL_REQUIRED:
          printer->Print(
              "if (!get$name$().isInitialized()) {\n"
              "  memoizedIsInitialized = 0;\n"
              "  return false;\n"
              "}\n",
              "type",
              name_resolver_->GetImmutableClassName(field->message_type()),
              "name", info->capitalized_name);
          break;
        case FieldDescriptor::LABEL_OPTIONAL:
          printer->Print(
              "if (has$name$()) {\n"
              "  if (!get$name$().isInitialized()) {\n"
              "    memoizedIsInitialized = 0;\n"
              "    return false;\n"
              "  }\n"
              "}\n",
              "name", info->capitalized_name);
          break;
        case FieldDescriptor::LABEL_REPEATED:
          if (IsMapEntry(field->message_type())) {
            printer->Print(
                "for ($type$ item : get$name$Map().values()) {\n"
                "  if (!item.isInitialized()) {\n"
                "    memoizedIsInitialized = 0;\n"
                "    return false;\n"
                "  }\n"
                "}\n",
                "type",
                MapValueImmutableClassdName(field->message_type(),
                                            name_resolver_),
                "name", info->capitalized_name);
          } else {
            printer->Print(
                "for (int i = 0; i < get$name$Count(); i++) {\n"
                "  if (!get$name$(i).isInitialized()) {\n"
                "    memoizedIsInitialized = 0;\n"
                "    return false;\n"
                "  }\n"
                "}\n",
                "type",
                name_resolver_->GetImmutableClassName(field->message_type()),
                "name", info->capitalized_name);
          }
          break;
      }
    }
  }

  if (descriptor_->extension_range_count() > 0) {
    printer->Print(
        "if (!extensionsAreInitialized()) {\n"
        "  memoizedIsInitialized = 0;\n"
        "  return false;\n"
        "}\n");
  }

  printer->Outdent();

  printer->Print("  memoizedIsInitialized = 1;\n");

  printer->Print(
      "  return true;\n"
      "}\n"
      "\n");
}